

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_normalize
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sigout,
              secp256k1_ecdsa_signature *sigin)

{
  int iVar1;
  secp256k1_ecdsa_signature *in_RCX;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar local_20;
  
  if (ctx != (secp256k1_context *)0x0) {
    if (sigin == (secp256k1_ecdsa_signature *)0x0) {
      (*(ctx->illegal_callback).fn)("sigin != NULL",(ctx->illegal_callback).data);
      iVar1 = 0;
    }
    else {
      secp256k1_ecdsa_signature_load
                ((secp256k1_context *)&stack0xffffffffffffffe4,&local_20,(secp256k1_scalar *)sigin,
                 in_RCX);
      iVar1 = secp256k1_scalar_is_high(&local_20);
      if (sigout != (secp256k1_ecdsa_signature *)0x0) {
        if (iVar1 != 0) {
          secp256k1_scalar_negate(&local_20,&local_20);
        }
        secp256k1_ecdsa_signature_save
                  (sigout,(secp256k1_scalar *)&stack0xffffffffffffffe4,&local_20);
      }
    }
    return iVar1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin[P]bitcoin/src/secp256k1/src/secp256k1.c"
          ,0x1b3,"test condition failed: ctx != NULL");
  abort();
}

Assistant:

int secp256k1_ecdsa_signature_normalize(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sigout, const secp256k1_ecdsa_signature *sigin) {
    secp256k1_scalar r, s;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sigin != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sigin);
    ret = secp256k1_scalar_is_high(&s);
    if (sigout != NULL) {
        if (ret) {
            secp256k1_scalar_negate(&s, &s);
        }
        secp256k1_ecdsa_signature_save(sigout, &r, &s);
    }

    return ret;
}